

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

double calculate_sd<dense_parameters>(vw *param_1,dense_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  int iVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> diff;
  allocator_type local_31;
  double local_30;
  vector<double,_std::allocator<double>_> local_28;
  
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  if (pwVar1 == pwVar1 + uVar2 + 1) {
    local_30 = 0.0;
  }
  else {
    lVar7 = 1L << ((byte)weights->_stride_shift & 0x3f);
    lVar6 = uVar2 * 4 + 4;
    do {
      calculate_sd<dense_parameters>::my_size = calculate_sd<dense_parameters>::my_size + 1;
      lVar6 = lVar6 + lVar7 * -4;
    } while (lVar6 != 0);
    local_30 = 0.0;
    lVar6 = 0;
    do {
      local_30 = local_30 + (double)*(float *)((long)pwVar1 + lVar6);
      lVar6 = lVar6 + lVar7 * 4;
    } while (uVar2 * 4 + 4 != lVar6);
  }
  iVar4 = calculate_sd<dense_parameters>::my_size;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,(long)calculate_sd<dense_parameters>::my_size,&local_31);
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  if (pwVar1 != pwVar1 + uVar2 + 1) {
    uVar3 = weights->_stride_shift;
    lVar6 = 0;
    pdVar5 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar5 = (double)*(float *)((long)pwVar1 + lVar6) - local_30 / (double)iVar4;
      pdVar5 = pdVar5 + 1;
      lVar6 = lVar6 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while (uVar2 * 4 + 4 != lVar6);
  }
  dVar8 = 0.0;
  for (pdVar5 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 != local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    dVar8 = dVar8 + *pdVar5 * *pdVar5;
  }
  dVar8 = dVar8 / (double)calculate_sd<dense_parameters>::my_size;
  if (dVar8 < 0.0) {
    local_30 = sqrt(dVar8);
  }
  else {
    local_30 = SQRT(dVar8);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_30;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}